

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O2

string * __thiscall
jbcoin::STAmount::getFullText_abi_cxx11_(string *__return_storage_ptr__,STAmount *this)

{
  bool bVar1;
  Currency *currency;
  AccountID *v;
  AccountID *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  (*(this->super_STBase)._vptr_STBase[6])(&local_60,this);
  std::operator+(&local_40,&local_60,"/");
  to_string_abi_cxx11_(&local_80,(jbcoin *)&this->mIssue,currency);
  std::operator+(&local_a0,&local_40,&local_80);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (this->mIsNative == false) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    bVar1 = beast::operator==(&this->mIssue);
    if (!bVar1) {
      this_00 = &(this->mIssue).account;
      noAccount();
      bVar1 = jbcoin::operator==(this_00,&noAccount::account);
      if (!bVar1) {
        toBase58_abi_cxx11_(&local_a0,(jbcoin *)this_00,v);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_a0);
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
STAmount::getFullText () const
{
    std::string ret;

    ret.reserve(64);
    ret = getText () + "/" + to_string (mIssue.currency);

    if (!mIsNative)
    {
        ret += "/";

        if (isXRP (*this))
            ret += "0";
        else if (mIssue.account == noAccount())
            ret += "1";
        else
            ret += to_string (mIssue.account);
    }

    return ret;
}